

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vector<float,_4> __thiscall
tcu::swizzleRB<float>(tcu *this,Vector<float,_4> *v,ChannelOrder src,ChannelOrder dst)

{
  float fVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  undefined8 in_XMM1_Qa;
  Vector<float,_4> VVar5;
  
  if (src == dst) {
    Vector<float,_4>::Vector((Vector<float,_4> *)this,v);
    fVar3 = extraout_XMM0_Da;
    fVar4 = extraout_XMM0_Db;
  }
  else {
    fVar1 = v->m_data[0];
    fVar4 = v->m_data[1];
    fVar3 = v->m_data[2];
    fVar2 = v->m_data[3];
    *(float *)this = fVar3;
    *(float *)(this + 4) = fVar4;
    *(float *)(this + 8) = fVar1;
    *(float *)(this + 0xc) = fVar2;
  }
  VVar5.m_data[1] = fVar4;
  VVar5.m_data[0] = fVar3;
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vector<float,_4>)VVar5.m_data;
}

Assistant:

Vector<T, 4> swizzleRB (const Vector<T, 4>& v, TextureFormat::ChannelOrder src, TextureFormat::ChannelOrder dst)
{
	if (src == dst)
		return v;
	else
	{
		DE_ASSERT((src == TextureFormat::RGB && dst == TextureFormat::BGR) ||
				  (src == TextureFormat::BGR && dst == TextureFormat::RGB) ||
				  (src == TextureFormat::RGBA && dst == TextureFormat::BGRA) ||
				  (src == TextureFormat::BGRA && dst == TextureFormat::RGBA));
		return v.swizzle(2,1,0,3);
	}
}